

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O2

void __thiscall
JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::flush
          (JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *this)

{
  HalfCycles cycles;
  
  if (this->is_flushed_ != false) {
    return;
  }
  this->is_flushed_ = true;
  this->did_flush_ = true;
  cycles.super_WrappedInt<HalfCycles>.length_ =
       (WrappedInt<HalfCycles>)(this->time_since_update_).super_WrappedInt<HalfCycles>.length_;
  (this->time_since_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  TI::TMS::TMS9918<(TI::TMS::Personality)0>::run_for(&this->object_,cycles);
  return;
}

Assistant:

forceinline void flush() {
			if(!is_flushed_) {
				did_flush_ = is_flushed_ = true;
				if constexpr (divider == 1) {
					const auto duration = time_since_update_.template flush<TargetTimeScale>();
					object_.run_for(duration);
				} else {
					const auto duration = time_since_update_.template divide<TargetTimeScale>(LocalTimeScale(divider));
					if(duration > TargetTimeScale(0))
						object_.run_for(duration);
				}
			}
		}